

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<const_void_*const_&> __thiscall
kj::Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>>::find<0ul,void_const*&>
          (Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>> *this,Entry *params)

{
  HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  Entry *t;
  ArrayPtr<const_void_*const> AVar3;
  Entry *local_50;
  Entry *local_48;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  NullableValue<unsigned_long> pos;
  Entry *params_local;
  Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  *this_local;
  
  pos.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)params;
  pHVar1 = get<0ul,kj::HashIndex<kj::_::HashSetCallbacks>const&>
                     ((HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>
                       *)(this + 0x20));
  AVar3 = Vector<const_void_*>::asPtr((Vector<const_void_*> *)this);
  fwd<void_const*&>((Entry *)pos.field_1);
  local_50 = AVar3.ptr;
  local_48 = (Entry *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (Entry *)pHVar1;
  HashIndex<kj::_::HashSetCallbacks>::find<void_const*const,void_const*&>
            ((HashIndex<kj::_::HashSetCallbacks> *)local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<const_void_*const_&>::Maybe((Maybe<const_void_*const_&> *)&this_local,(void *)0x0);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<const_void_*>::operator[]((Vector<const_void_*> *)this,*puVar2);
    Maybe<const_void_*const_&>::Maybe((Maybe<const_void_*const_&> *)&this_local,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<const_void_*const_&>)(Entry *)this_local;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}